

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

action Search::single_prediction_notLDF
                 (search_private *priv,example *ec,int policy,action *allowed_actions,
                 size_t allowed_actions_cnt,float *allowed_actions_cost,float *a_cost,
                 action override_action)

{
  uint64_t *puVar1;
  long lVar2;
  float fVar3;
  action aVar4;
  int iVar5;
  BaseTask *pBVar6;
  wclass *pwVar7;
  action_score *paVar8;
  stringstream *psVar9;
  _func_void_int_string_v_array<char> *p_Var10;
  label_t lVar11;
  label_t lVar12;
  size_t sVar13;
  v_array<char> vVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  SearchState SVar17;
  polylabel *ppVar18;
  single_learner *psVar19;
  float *pfVar20;
  wclass *pwVar21;
  ostream *poVar22;
  vw_exception *this;
  long lVar23;
  undefined1 uVar24;
  action_score *paVar25;
  byte bVar26;
  long lVar27;
  ulong uVar28;
  float *pfVar29;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *pvVar30;
  ulong uVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  v_array<Search::action_cache> *this_cache;
  polylabel old_label;
  pair<COST_SENSITIVE::wclass_&,_bool> p;
  undefined8 in_stack_fffffffffffffda8;
  action aVar36;
  float in_stack_fffffffffffffdb4;
  label_t *plVar37;
  undefined4 in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  v_array<Search::action_cache> *local_238;
  vw *local_230;
  label_t local_228;
  label_t lStack_220;
  label_t local_218;
  label_t lStack_210;
  label_t local_208;
  undefined1 *local_1f8;
  undefined1 local_1e8 [16];
  string local_1d8;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  ostream local_1a8;
  
  local_230 = priv->all;
  local_208 = (label_t)(ec->l).cb_eval.event.costs.erase_count;
  local_228 = (ec->l).multi;
  lStack_220 = (label_t)(ec->l).cs.costs._end;
  local_218 = (label_t)(ec->l).cs.costs.end_array;
  lStack_210 = (label_t)(ec->l).cs.costs.erase_count;
  plVar37 = (label_t *)&ec->l;
  pBVar6 = priv->metaoverride;
  bVar26 = 1;
  if ((pBVar6 == (BaseTask *)0x0 || priv->metatask == (search_metatask *)0x0) ||
      priv->state != INIT_TRAIN) {
    if (pBVar6 != (BaseTask *)0x0) {
      if ((override_action == 0xffffffff) &&
         (pBVar6->_foreach_action == (_func_void_search_ptr_size_t_float_action_bool_float *)0x0))
      goto LAB_0025cc0a;
      goto LAB_0025c57d;
    }
    if (override_action != 0xffffffff) goto LAB_0025c57d;
LAB_0025cc0a:
    bVar26 = priv->active_csoaa;
    if (allowed_actions_cnt != 0 || (bVar26 & 1) != 0) goto LAB_0025c57d;
    lVar11 = (label_t)(priv->empty_cs_label).costs._begin;
    pwVar21 = (priv->empty_cs_label).costs._end;
    sVar13 = (priv->empty_cs_label).costs.erase_count;
    (ec->l).cs.costs.end_array = (priv->empty_cs_label).costs.end_array;
    (ec->l).cs.costs.erase_count = sVar13;
    *plVar37 = lVar11;
    (ec->l).cs.costs._end = pwVar21;
    bVar26 = 0;
  }
  else {
LAB_0025c57d:
    ppVar18 = allowed_actions_to_ld(priv,1,allowed_actions,allowed_actions_cnt,allowed_actions_cost)
    ;
    lVar11 = (label_t)(ppVar18->cs).costs._end;
    lVar12 = (label_t)(ppVar18->cs).costs.end_array;
    uVar15 = *(undefined4 *)&((v_array<COST_SENSITIVE::wclass> *)ppVar18)->erase_count;
    uVar16 = *(undefined4 *)((long)&((v_array<COST_SENSITIVE::wclass> *)ppVar18)->erase_count + 4);
    *plVar37 = ppVar18->multi;
    plVar37[1] = lVar11;
    plVar37[2] = lVar12;
    plVar37[3].label = uVar15;
    plVar37[3].weight = (float)uVar16;
    uVar15 = *(undefined4 *)((long)&(((label *)((long)ppVar18 + 8))->costs).erase_count + 4);
    plVar37[4].label = *(undefined4 *)&(((label *)((long)ppVar18 + 8))->costs).erase_count;
    plVar37[4].weight = (float)uVar15;
  }
  psVar19 = LEARNER::as_singleline<char,char>(priv->base_learner);
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(psVar19 + 0xe0) * policy);
  (**(code **)(psVar19 + 0x30))(*(undefined8 *)(psVar19 + 0x18),*(undefined8 *)(psVar19 + 0x20),ec);
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 - (ulong)(uint)(policy * *(int *)(psVar19 + 0xe0));
  aVar36 = override_action;
  if (override_action == 0xffffffff) {
    aVar36 = (ec->pred).multiclass;
  }
  *a_cost = ec->partial_prediction;
  if ((bVar26 & 1) != 0) {
    pwVar21 = (ec->l).cs.costs._begin;
    pwVar7 = (ec->l).cs.costs._end;
    lVar27 = (long)pwVar7 - (long)pwVar21 >> 4;
    if (pwVar7 == pwVar21) {
      fVar32 = 3.4028235e+38;
    }
    else {
      lVar23 = lVar27 + (ulong)(lVar27 == 0);
      pfVar20 = &pwVar21->wap_value;
      fVar34 = 3.4028235e+38;
      do {
        pfVar29 = pfVar20 + -1;
        if (priv->cb_learner != false) {
          pfVar29 = pfVar20;
        }
        fVar32 = *pfVar29;
        if (fVar34 <= *pfVar29) {
          fVar32 = fVar34;
        }
        pfVar20 = pfVar20 + 4;
        lVar23 = lVar23 + -1;
        fVar34 = fVar32;
      } while (lVar23 != 0);
    }
    local_238 = (v_array<Search::action_cache> *)0x0;
    if ((((priv->state == INIT_TRAIN) && (priv->metatask != (search_metatask *)0x0)) &&
        (override_action == 0xffffffff)) && (priv->metaoverride != (BaseTask *)0x0)) {
      local_238 = (v_array<Search::action_cache> *)operator_new(0x20);
      local_238->_begin = (action_cache *)0x0;
      local_238->_end = (action_cache *)0x0;
      local_238->end_array = (action_cache *)0x0;
      local_238->erase_count = 0;
    }
    in_stack_fffffffffffffdb4 = fVar32;
    if (pwVar7 != pwVar21) {
      lVar27 = lVar27 + (ulong)(lVar27 == 0);
      lVar23 = 8;
      do {
        lVar2 = (long)*plVar37 + lVar23;
        pfVar20 = (float *)((long)*plVar37 + lVar23);
        if (priv->cb_learner != false) {
          pfVar20 = (float *)(lVar2 + 4);
        }
        aVar4 = *(action *)(lVar2 + -4);
        fVar34 = *pfVar20;
        pBVar6 = priv->metaoverride;
        if ((pBVar6 != (BaseTask *)0x0) &&
           (pBVar6->_foreach_action != (_func_void_search_ptr_size_t_float_action_bool_float *)0x0))
        {
          (*pBVar6->_foreach_action)(pBVar6->sch,priv->t - 1,fVar32,aVar4,aVar4 == aVar36,fVar34);
          fVar32 = in_stack_fffffffffffffdb4;
          in_stack_fffffffffffffdb4 = fVar32;
          in_stack_fffffffffffffdc4 = fVar34;
        }
        if (aVar4 == override_action) {
          *a_cost = fVar34;
        }
        if (local_238 != (v_array<Search::action_cache> *)0x0) {
          local_1b8._4_4_ = aVar4;
          local_1b8._0_4_ = fVar32;
          uStack_1b0 = (pair<COST_SENSITIVE::wclass_&,_bool> *)
                       CONCAT71(uStack_1b0._1_7_,aVar4 == aVar36);
          uStack_1b0 = (pair<COST_SENSITIVE::wclass_&,_bool> *)
                       CONCAT44(fVar34,(undefined4)uStack_1b0);
          fVar32 = in_stack_fffffffffffffdb4;
          v_array<Search::action_cache>::push_back(local_238,(action_cache *)local_1b8);
          in_stack_fffffffffffffdb4 = fVar32;
        }
        lVar23 = lVar23 + 0x10;
        lVar27 = lVar27 + -1;
      } while (lVar27 != 0);
    }
    if (local_238 != (v_array<Search::action_cache> *)0x0) {
      v_array<v_array<Search::action_cache>_*>::push_back(&priv->memo_foreach_action,&local_238);
    }
  }
  SVar17 = priv->state;
  if ((SVar17 != INIT_TRAIN) || (-1.0 < priv->subsample_timesteps)) {
LAB_0025c8d4:
    if (SVar17 != INIT_TRAIN) goto LAB_0025ca14;
  }
  else {
    pwVar21 = (ec->l).cs.costs._begin;
    lVar27 = (long)(ec->l).cs.costs._end - (long)pwVar21;
    if (lVar27 != 0) {
      lVar27 = lVar27 >> 4;
      lVar27 = lVar27 + (ulong)(lVar27 == 0);
      pfVar20 = &pwVar21->wap_value;
      fVar32 = 3.4028235e+38;
      fVar34 = 3.4028235e+38;
      do {
        pfVar29 = pfVar20 + -1;
        if (priv->cb_learner != false) {
          pfVar29 = pfVar20;
        }
        fVar3 = *pfVar29;
        fVar33 = fVar34;
        fVar35 = fVar3;
        if ((fVar34 <= fVar3) && (fVar33 = fVar32, fVar35 = fVar34, fVar3 < fVar32)) {
          fVar33 = fVar3;
        }
        pfVar20 = pfVar20 + 4;
        lVar27 = lVar27 + -1;
        fVar32 = fVar33;
        fVar34 = fVar35;
      } while (lVar27 != 0);
      if (fVar33 < 3.4028235e+38) {
        uStack_1b0 = (pair<COST_SENSITIVE::wclass_&,_bool> *)(priv->meta_t + priv->t);
        local_1b8._0_4_ = fVar33 - fVar35;
        v_array<std::pair<float,_unsigned_long>_>::push_back
                  (&priv->active_uncertainty,(pair<float,_unsigned_long> *)local_1b8);
        SVar17 = priv->state;
        goto LAB_0025c8d4;
      }
    }
  }
  if (priv->active_csoaa == true) {
    if (priv->cb_learner == true) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a8,"cannot use active_csoaa with cb learning",0x28);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                 ,0x496,&local_1d8);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    uVar28 = (priv->t + priv->meta_t) - 1;
    pvVar30 = (priv->active_known)._begin;
    if ((ulong)((long)(priv->active_known)._end - (long)pvVar30 >> 5) <= uVar28) {
      do {
        local_1a8._vptr_basic_ostream = (_func_int **)0x0;
        local_1a8._8_8_ = 0;
        local_1b8 = (undefined1  [8])0x0;
        uStack_1b0 = (pair<COST_SENSITIVE::wclass_&,_bool> *)0x0;
        v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::push_back
                  (&priv->active_known,
                   (v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)local_1b8);
        pvVar30 = (priv->active_known)._end;
        pvVar30[-1].end_array = (pair<COST_SENSITIVE::wclass_&,_bool> *)0x0;
        pvVar30[-1].erase_count = 0;
        pvVar30[-1]._begin = (pair<COST_SENSITIVE::wclass_&,_bool> *)0x0;
        pvVar30[-1]._end = (pair<COST_SENSITIVE::wclass_&,_bool> *)0x0;
        pvVar30 = (priv->active_known)._begin;
      } while ((ulong)((long)(priv->active_known)._end - (long)pvVar30 >> 5) <= uVar28);
    }
    v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::clear(pvVar30 + uVar28);
    pwVar21 = (ec->l).cs.costs._begin;
    if ((ec->l).cs.costs._end != pwVar21) {
      uVar31 = 0;
      do {
        paVar25 = (ec->pred).a_s._begin;
        paVar8 = (action_score *)(ec->pred).scalars._end;
        if (paVar25 != paVar8) {
          do {
            if (paVar25->action == pwVar21[uVar31].class_index) {
              uVar24 = 1;
              goto LAB_0025c9d4;
            }
            paVar25 = (action_score *)&paVar25->score;
          } while (paVar25 != paVar8);
        }
        uVar24 = 0;
LAB_0025c9d4:
        local_1b8 = (undefined1  [8])(pwVar21 + uVar31);
        uStack_1b0 = (pair<COST_SENSITIVE::wclass_&,_bool> *)CONCAT71(uStack_1b0._1_7_,uVar24);
        v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::push_back
                  ((priv->active_known)._begin + uVar28,
                   (pair<COST_SENSITIVE::wclass_&,_bool> *)local_1b8);
        uVar31 = uVar31 + 1;
        pwVar21 = (ec->l).cs.costs._begin;
      } while (uVar31 < (ulong)((long)(ec->l).cs.costs._end - (long)pwVar21 >> 4));
    }
  }
  SVar17 = priv->state;
LAB_0025ca14:
  if ((SVar17 == INIT_TEST) && (0 < local_230->raw_prediction)) {
    psVar9 = priv->rawOutputStringStream;
    local_1b8 = (undefined1  [8])&local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
    std::__cxx11::stringbuf::str((string *)(psVar9 + 0x18));
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8);
    }
    if ((ec->l).cs.costs._end != (ec->l).cs.costs._begin) {
      lVar27 = 8;
      uVar28 = 0;
      do {
        if (uVar28 != 0) {
          local_1b8[0] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(priv->rawOutputStringStream + 0x10),local_1b8,1);
        }
        poVar22 = std::ostream::_M_insert<unsigned_long>
                            ((ulong)(priv->rawOutputStringStream + 0x10));
        local_1b8[0] = 0x3a;
        std::__ostream_insert<char,std::char_traits<char>>(poVar22,local_1b8,1);
        pwVar21 = (ec->l).cs.costs._begin;
        pfVar20 = &pwVar21->x;
        if (priv->cb_learner != false) {
          pfVar20 = (float *)&pwVar21->class_index;
        }
        std::ostream::_M_insert<double>((double)*(float *)((long)pfVar20 + lVar27));
        uVar28 = uVar28 + 1;
        lVar27 = lVar27 + 0x10;
      } while (uVar28 < (ulong)((long)(ec->l).cs.costs._end - (long)(ec->l).cs.costs._begin >> 4));
    }
    p_Var10 = local_230->print_text;
    iVar5 = local_230->raw_prediction;
    std::__cxx11::stringbuf::str();
    vVar14._end._0_4_ = aVar36;
    vVar14._begin = (char *)in_stack_fffffffffffffda8;
    vVar14._end._4_4_ = in_stack_fffffffffffffdb4;
    vVar14.end_array = (char *)plVar37;
    vVar14.erase_count._0_4_ = in_stack_fffffffffffffdc0;
    vVar14.erase_count._4_4_ = in_stack_fffffffffffffdc4;
    (*p_Var10)(iVar5,(string)ec->tag,vVar14);
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8);
    }
  }
  plVar37[4] = local_208;
  plVar37[2] = local_218;
  plVar37[3] = lStack_210;
  *plVar37 = local_228;
  plVar37[1] = lStack_220;
  priv->total_predictions_made = priv->total_predictions_made + 1;
  priv->num_features = priv->num_features + ec->num_features;
  return aVar36;
}

Assistant:

action single_prediction_notLDF(search_private& priv, example& ec, int policy, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost, float& a_cost,
    action override_action)  // if override_action != -1, then we return it as the action and a_cost is set to the
                             // appropriate cost for that action
{
  vw& all = *priv.all;
  polylabel old_label = ec.l;
  bool need_partial_predictions = need_memo_foreach_action(priv) ||
      (priv.metaoverride && priv.metaoverride->_foreach_action) || (override_action != (action)-1) || priv.active_csoaa;
  if ((allowed_actions_cnt > 0) || need_partial_predictions)
    ec.l = allowed_actions_to_ld(priv, 1, allowed_actions, allowed_actions_cnt, allowed_actions_cost);
  else
    ec.l.cs = priv.empty_cs_label;

  cdbg << "allowed_actions_cnt=" << allowed_actions_cnt << ", ec.l = [";
  for (size_t i = 0; i < ec.l.cs.costs.size(); i++)
    cdbg << ' ' << ec.l.cs.costs[i].class_index << ':' << ec.l.cs.costs[i].x;
  cdbg << " ]" << endl;

  as_singleline(priv.base_learner)->predict(ec, policy);

  uint32_t act = ec.pred.multiclass;
  cdbg << "a=" << act << " from";
  if (allowed_actions)
  {
    for (size_t ii = 0; ii < allowed_actions_cnt; ii++) cdbg << ' ' << allowed_actions[ii];
  }
  cdbg << endl;
  a_cost = ec.partial_prediction;
  cdbg << "a_cost = " << a_cost << endl;

  if (override_action != (action)-1)
    act = override_action;

  if (need_partial_predictions)
  {
    size_t K = cs_get_costs_size(priv.cb_learner, ec.l);
    float min_cost = FLT_MAX;
    for (size_t k = 0; k < K; k++)
    {
      float cost = cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
      if (cost < min_cost)
        min_cost = cost;
    }
    v_array<action_cache>* this_cache = nullptr;
    if (need_memo_foreach_action(priv) && (override_action == (action)-1))
    {
      this_cache = new v_array<action_cache>();
      *this_cache = v_init<action_cache>();
    }
    for (size_t k = 0; k < K; k++)
    {
      action cl = cs_get_cost_index(priv.cb_learner, ec.l, k);
      float cost = cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
      if (priv.metaoverride && priv.metaoverride->_foreach_action)
        priv.metaoverride->_foreach_action(*priv.metaoverride->sch, priv.t - 1, min_cost, cl, cl == act, cost);
      if (override_action == cl)
        a_cost = cost;
      if (this_cache)
        this_cache->push_back(action_cache(min_cost, cl, cl == act, cost));
    }
    if (this_cache)
    {
      assert(priv.memo_foreach_action.size() == priv.meta_t + priv.t - 1);
      priv.memo_foreach_action.push_back(this_cache);
      cdbg << "memo_foreach_action[" << priv.meta_t + priv.t - 1 << "] = " << this_cache << endl;
    }
  }

  if ((priv.state == INIT_TRAIN) && (priv.subsample_timesteps <= -1))  // active learning
  {
    size_t K = cs_get_costs_size(priv.cb_learner, ec.l);
    float min_cost = FLT_MAX, min_cost2 = FLT_MAX;
    for (size_t k = 0; k < K; k++)
    {
      float cost = cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
      if (cost < min_cost)
      {
        min_cost2 = min_cost;
        min_cost = cost;
      }
      else if (cost < min_cost2)
      {
        min_cost2 = cost;
      }
    }
    if (min_cost2 < FLT_MAX)
      priv.active_uncertainty.push_back(make_pair(min_cost2 - min_cost, priv.t + priv.meta_t));
  }
  if ((priv.state == INIT_TRAIN) && priv.active_csoaa)
  {
    if (priv.cb_learner)
      THROW("cannot use active_csoaa with cb learning");
    size_t cur_t = priv.t + priv.meta_t - 1;
    while (priv.active_known.size() <= cur_t)
    {
      priv.active_known.push_back(v_array<pair<CS::wclass&, bool>>());
      priv.active_known[priv.active_known.size() - 1] = v_init<pair<CS::wclass&, bool>>();
      cdbg << "active_known length now " << priv.active_known.size() << endl;
    }
    priv.active_known[cur_t].clear();
    assert(ec.l.cs.costs.size() > 0);
    for (size_t k = 0; k < ec.l.cs.costs.size(); k++)
    {
      /* priv.active_known[cur_t].push_back( ec.l.cs.costs[k].pred_is_certain
                                          ? ec.l.cs.costs[k].partial_prediction
                                          : FLT_MAX );
                                          cdbg << "active_known[" << cur_t << "][" << (priv.active_known[cur_t].size() -
         1) << "] = certain=" << ec.l.cs.costs[k].pred_is_certain << ", cost=" << ec.l.cs.costs[k].partial_prediction <<
         "}" << endl; */
      CS::wclass& wc = ec.l.cs.costs[k];
      // Get query_needed from pred
      bool query_needed = v_array_contains(ec.pred.multilabels.label_v, wc.class_index);
      pair<CS::wclass&, bool> p = {wc, query_needed};
      // Push into active_known[cur_t] with wc
      priv.active_known[cur_t].push_back(p);
      // cdbg << "active_known[" << cur_t << "][" << (priv.active_known[cur_t].size() - 1) << "] = " << wc.class_index
      // << ':' << wc.x << " pp=" << wc.partial_prediction << " query_needed=" << wc.query_needed << " max_pred=" <<
      // wc.max_pred << " min_pred=" << wc.min_pred << " is_range_overlapped=" << wc.is_range_overlapped << "
      // is_range_large=" << wc.is_range_large << endl;
      // query_needed=" << ec.l.cs.costs[k].query_needed << ", cost=" << ec.l.cs.costs[k].partial_prediction << "}" <<
      // endl;
    }
  }

  // generate raw predictions if necessary
  if ((priv.state == INIT_TEST) && (all.raw_prediction > 0))
  {
    priv.rawOutputStringStream->str("");
    for (size_t k = 0; k < cs_get_costs_size(priv.cb_learner, ec.l); k++)
    {
      if (k > 0)
        (*priv.rawOutputStringStream) << ' ';
      (*priv.rawOutputStringStream) << cs_get_cost_index(priv.cb_learner, ec.l, k) << ':'
                                    << cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
    }
    all.print_text(all.raw_prediction, priv.rawOutputStringStream->str(), ec.tag);
  }

  ec.l = old_label;

  priv.total_predictions_made++;
  priv.num_features += ec.num_features;

  return act;
}